

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O2

Direction __thiscall
spvtools::opt::LoopPeelingPass::LoopPeelingInfo::GetPeelingInfo
          (LoopPeelingInfo *this,BasicBlock *bb)

{
  SExpression lhs_00;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  bool bVar6;
  uint32_t uVar7;
  int iVar8;
  Instruction *pIVar9;
  DefUseManager *this_00;
  Instruction *pIVar10;
  SENode *pSVar11;
  long lVar12;
  Direction DVar13;
  SERecurrentNode *rhs_00;
  Direction DVar19;
  ScalarEvolutionAnalysis *extraout_RDX;
  ScalarEvolutionAnalysis *pSVar20;
  CmpOperator cmp_op;
  ScalarEvolutionAnalysis *in_R8;
  undefined1 auVar21 [16];
  SExpression lhs_01;
  SExpression rhs_01;
  SExpression lhs;
  SExpression rhs;
  SExpression __tmp;
  Direction DVar14;
  Direction DVar15;
  Direction DVar16;
  Direction DVar17;
  Direction DVar18;
  
  pIVar9 = BasicBlock::terminator(bb);
  if (pIVar9->opcode_ == OpBranchConditional) {
    this_00 = IRContext::get_def_use_mgr(this->context_);
    pIVar9 = BasicBlock::terminator(bb);
    uVar7 = Instruction::GetSingleWordInOperand(pIVar9,0);
    pIVar9 = analysis::DefUseManager::GetDef(this_00,uVar7);
    if (9 < pIVar9->opcode_ - OpIEqual) {
      DVar19.first = kNone;
      DVar19.second = 0;
      return DVar19;
    }
    uVar7 = GetFirstLoopInvariantOperand(this,pIVar9);
    if ((uVar7 != 0) && (uVar7 = GetFirstNonLoopInvariantOperand(this,pIVar9), uVar7 != 0)) {
      pSVar20 = this->scev_analysis_;
      uVar7 = Instruction::GetSingleWordInOperand(pIVar9,0);
      pIVar10 = analysis::DefUseManager::GetDef(this_00,uVar7);
      pSVar11 = ScalarEvolutionAnalysis::AnalyzeInstruction(pSVar20,pIVar10);
      SExpression::SExpression(&lhs,pSVar11);
      iVar8 = (*(code *)**(undefined8 **)CONCAT44(lhs.node_._4_4_,lhs.node_._0_4_))();
      if (iVar8 == 6) {
        DVar14.first = kNone;
        DVar14.second = 0;
        return DVar14;
      }
      pSVar20 = this->scev_analysis_;
      cmp_op = kGT;
      uVar7 = Instruction::GetSingleWordInOperand(pIVar9,1);
      pIVar10 = analysis::DefUseManager::GetDef(this_00,uVar7);
      pSVar11 = ScalarEvolutionAnalysis::AnalyzeInstruction(pSVar20,pIVar10);
      SExpression::SExpression(&rhs,pSVar11);
      iVar8 = (*(code *)**(undefined8 **)CONCAT44(rhs.node_._4_4_,rhs.node_._0_4_))();
      if (iVar8 != 6) {
        bVar5 = ScalarEvolutionAnalysis::IsLoopInvariant
                          (this->scev_analysis_,this->loop_,
                           (SENode *)CONCAT44(lhs.node_._4_4_,lhs.node_._0_4_));
        bVar6 = ScalarEvolutionAnalysis::IsLoopInvariant
                          (this->scev_analysis_,this->loop_,
                           (SENode *)CONCAT44(rhs.node_._4_4_,rhs.node_._0_4_));
        if (bVar5 != bVar6) {
          pSVar20 = extraout_RDX;
          if (!bVar5) {
            lVar12 = (**(code **)(*(long *)CONCAT44(lhs.node_._4_4_,lhs.node_._0_4_) + 0x30))();
            if (lVar12 == 0) {
              DVar16.first = kNone;
              DVar16.second = 0;
              return DVar16;
            }
            auVar21 = (**(code **)(*(long *)CONCAT44(lhs.node_._4_4_,lhs.node_._0_4_) + 0x30))();
            pSVar20 = auVar21._8_8_;
            if (*(Loop **)(auVar21._0_8_ + 0x40) != this->loop_) {
              DVar15.first = kNone;
              DVar15.second = 0;
              return DVar15;
            }
          }
          if (!bVar6) {
            lVar12 = (**(code **)(*(long *)CONCAT44(rhs.node_._4_4_,rhs.node_._0_4_) + 0x30))();
            if (lVar12 == 0) {
              DVar18.first = kNone;
              DVar18.second = 0;
              return DVar18;
            }
            auVar21 = (**(code **)(*(long *)CONCAT44(rhs.node_._4_4_,rhs.node_._0_4_) + 0x30))();
            pSVar20 = auVar21._8_8_;
            if (*(Loop **)(auVar21._0_8_ + 0x40) != this->loop_) {
              DVar17.first = kNone;
              DVar17.second = 0;
              return DVar17;
            }
          }
          uVar4 = lhs.scev_._4_4_;
          uVar3 = lhs.scev_._0_4_;
          uVar2 = lhs.node_._4_4_;
          uVar1 = lhs.node_._0_4_;
          switch(pIVar9->opcode_) {
          case OpIEqual:
          case OpINotEqual:
            lhs_01.node_._4_4_ = lhs.node_._4_4_;
            lhs_01.node_._0_4_ = lhs.node_._0_4_;
            rhs_01.node_._4_4_ = rhs.node_._4_4_;
            rhs_01.node_._0_4_ = rhs.node_._0_4_;
            lhs_01.scev_ = pSVar20;
            rhs_01.scev_ = in_R8;
            DVar19 = HandleEquality(this,lhs_01,rhs_01);
            return DVar19;
          case OpUGreaterThan:
          case OpSGreaterThan:
            break;
          case OpUGreaterThanEqual:
          case OpSGreaterThanEqual:
            cmp_op = kGE;
            break;
          case OpULessThan:
          case OpSLessThan:
            cmp_op = kLT;
            break;
          case OpULessThanEqual:
          case OpSLessThanEqual:
            cmp_op = kLE;
            break;
          default:
            goto LAB_00215342;
          }
          if (!bVar5) {
            lhs.node_._0_4_ = rhs.node_._0_4_;
            lhs.node_._4_4_ = rhs.node_._4_4_;
            lhs.scev_._0_4_ = rhs.scev_._0_4_;
            lhs.scev_._4_4_ = rhs.scev_._4_4_;
            rhs.node_._0_4_ = uVar1;
            rhs.node_._4_4_ = uVar2;
            rhs.scev_._0_4_ = uVar3;
            rhs.scev_._4_4_ = uVar4;
            cmp_op = (&DAT_002df4c0)[cmp_op];
          }
          lhs_00.node_._4_4_ = lhs.node_._4_4_;
          lhs_00.node_._0_4_ = lhs.node_._0_4_;
          lhs_00.scev_._0_4_ = lhs.scev_._0_4_;
          lhs_00.scev_._4_4_ = lhs.scev_._4_4_;
          rhs_00 = (SERecurrentNode *)
                   (**(code **)(*(long *)CONCAT44(rhs.node_._4_4_,rhs.node_._0_4_) + 0x30))();
          DVar19 = HandleInequality(this,cmp_op,lhs_00,rhs_00);
          return DVar19;
        }
      }
    }
  }
LAB_00215342:
  DVar13.first = kNone;
  DVar13.second = 0;
  return DVar13;
}

Assistant:

LoopPeelingPass::LoopPeelingInfo::Direction
LoopPeelingPass::LoopPeelingInfo::GetPeelingInfo(BasicBlock* bb) const {
  if (bb->terminator()->opcode() != spv::Op::OpBranchConditional) {
    return GetNoneDirection();
  }

  analysis::DefUseManager* def_use_mgr = context_->get_def_use_mgr();

  Instruction* condition =
      def_use_mgr->GetDef(bb->terminator()->GetSingleWordInOperand(0));

  if (!IsHandledCondition(condition->opcode())) {
    return GetNoneDirection();
  }

  if (!GetFirstLoopInvariantOperand(condition)) {
    // No loop invariant, it cannot be peeled by this pass.
    return GetNoneDirection();
  }
  if (!GetFirstNonLoopInvariantOperand(condition)) {
    // Seems to be a job for the unswitch pass.
    return GetNoneDirection();
  }

  // Left hand-side.
  SExpression lhs = scev_analysis_->AnalyzeInstruction(
      def_use_mgr->GetDef(condition->GetSingleWordInOperand(0)));
  if (lhs->GetType() == SENode::CanNotCompute) {
    // Can't make any conclusion.
    return GetNoneDirection();
  }

  // Right hand-side.
  SExpression rhs = scev_analysis_->AnalyzeInstruction(
      def_use_mgr->GetDef(condition->GetSingleWordInOperand(1)));
  if (rhs->GetType() == SENode::CanNotCompute) {
    // Can't make any conclusion.
    return GetNoneDirection();
  }

  // Only take into account recurrent expression over the current loop.
  bool is_lhs_rec = !scev_analysis_->IsLoopInvariant(loop_, lhs);
  bool is_rhs_rec = !scev_analysis_->IsLoopInvariant(loop_, rhs);

  if ((is_lhs_rec && is_rhs_rec) || (!is_lhs_rec && !is_rhs_rec)) {
    return GetNoneDirection();
  }

  if (is_lhs_rec) {
    if (!lhs->AsSERecurrentNode() ||
        lhs->AsSERecurrentNode()->GetLoop() != loop_) {
      return GetNoneDirection();
    }
  }
  if (is_rhs_rec) {
    if (!rhs->AsSERecurrentNode() ||
        rhs->AsSERecurrentNode()->GetLoop() != loop_) {
      return GetNoneDirection();
    }
  }

  // If the op code is ==, then we try a peel before or after.
  // If opcode is not <, >, <= or >=, we bail out.
  //
  // For the remaining cases, we canonicalize the expression so that the
  // constant expression is on the left hand side and the recurring expression
  // is on the right hand side. If we swap hand side, then < becomes >, <=
  // becomes >= etc.
  // If the opcode is <=, then we add 1 to the right hand side and do the peel
  // check on <.
  // If the opcode is >=, then we add 1 to the left hand side and do the peel
  // check on >.

  CmpOperator cmp_operator;
  switch (condition->opcode()) {
    default:
      return GetNoneDirection();
    case spv::Op::OpIEqual:
    case spv::Op::OpINotEqual:
      return HandleEquality(lhs, rhs);
    case spv::Op::OpUGreaterThan:
    case spv::Op::OpSGreaterThan: {
      cmp_operator = CmpOperator::kGT;
      break;
    }
    case spv::Op::OpULessThan:
    case spv::Op::OpSLessThan: {
      cmp_operator = CmpOperator::kLT;
      break;
    }
    // We add one to transform >= into > and <= into <.
    case spv::Op::OpUGreaterThanEqual:
    case spv::Op::OpSGreaterThanEqual: {
      cmp_operator = CmpOperator::kGE;
      break;
    }
    case spv::Op::OpULessThanEqual:
    case spv::Op::OpSLessThanEqual: {
      cmp_operator = CmpOperator::kLE;
      break;
    }
  }

  // Force the left hand side to be the non recurring expression.
  if (is_lhs_rec) {
    std::swap(lhs, rhs);
    switch (cmp_operator) {
      case CmpOperator::kLT: {
        cmp_operator = CmpOperator::kGT;
        break;
      }
      case CmpOperator::kGT: {
        cmp_operator = CmpOperator::kLT;
        break;
      }
      case CmpOperator::kLE: {
        cmp_operator = CmpOperator::kGE;
        break;
      }
      case CmpOperator::kGE: {
        cmp_operator = CmpOperator::kLE;
        break;
      }
    }
  }
  return HandleInequality(cmp_operator, lhs, rhs->AsSERecurrentNode());
}